

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

Frag __thiscall
re2::Regexp::Walker<re2::Frag>::WalkInternal
          (Walker<re2::Frag> *this,Regexp *re,Frag top_arg,bool use_copy)

{
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  *psVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  ostream *poVar5;
  PatchList extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  ulong uVar7;
  Frag *pFVar8;
  undefined4 extraout_var_01;
  PatchList extraout_var_02;
  size_type sVar9;
  Frag *local_2c8;
  WalkState<re2::Frag> local_278;
  undefined8 local_248;
  undefined8 local_240;
  Regexp **local_238;
  Regexp **sub;
  undefined8 local_224;
  byte local_219;
  Frag FStack_218;
  bool stop;
  Frag local_210;
  Regexp *local_208;
  Regexp *re_1;
  WalkState<re2::Frag> *s;
  WalkState<re2::Frag> local_1f0;
  LogMessage local_1b0;
  byte local_29;
  Regexp *pRStack_28;
  bool use_copy_local;
  Regexp *re_local;
  Walker<re2::Frag> *this_local;
  Frag top_arg_local;
  Frag t;
  
  local_29 = use_copy;
  pRStack_28 = re;
  re_local = (Regexp *)this;
  this_local = (Walker<re2::Frag> *)top_arg;
  Reset(this);
  if (pRStack_28 == (Regexp *)0x0) {
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/walker-inl.h",
               0xa0);
    poVar5 = LogMessage::stream(&local_1b0);
    std::operator<<(poVar5,"Walk NULL");
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    return (Frag)this_local;
  }
  psVar1 = this->stack_;
  s = (WalkState<re2::Frag> *)this_local;
  WalkState<re2::Frag>::WalkState(&local_1f0,pRStack_28,(Frag)this_local);
  std::
  stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
  ::push(psVar1,&local_1f0);
  do {
    while( true ) {
      Frag::Frag(&top_arg_local);
      re_1 = (Regexp *)
             std::
             stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
             ::top(this->stack_);
      local_208 = ((reference)re_1)->re;
      if (((reference)re_1)->n != -1) break;
      iVar4 = this->max_visits_ + -1;
      this->max_visits_ = iVar4;
      if (iVar4 < 0) {
        this->stopped_early_ = true;
        FStack_218 = ((reference)re_1)->parent_arg;
        local_210.begin = (*this->_vptr_Walker[5])(this,local_208,FStack_218);
        local_210.end.p = extraout_var.p;
        top_arg_local = local_210;
      }
      else {
        local_219 = 0;
        unique0x00012000 = ((reference)re_1)->parent_arg;
        iVar4 = (*this->_vptr_Walker[2])(this,local_208,unique0x00012000,&local_219);
        local_224 = CONCAT44(extraout_var_00,iVar4);
        *(undefined8 *)((long)&re_1->down_ + 4) = local_224;
        if ((local_219 & 1) == 0) {
          *(undefined4 *)&re_1->field_5 = 0;
          re_1[1].op_ = '\0';
          re_1[1].simple_ = '\0';
          re_1[1].parse_flags_ = 0;
          re_1[1].ref_ = 0;
          re_1[1].nsub_ = 0;
          if (local_208->nsub_ == 1) {
            *(undefined1 **)(re_1 + 1) = (undefined1 *)((long)&re_1->field_7 + 4);
          }
          else if (1 < local_208->nsub_) {
            uVar6 = CONCAT62(0,local_208->nsub_);
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar6;
            uVar7 = SUB168(auVar3 * ZEXT816(8),0);
            if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
              uVar7 = 0xffffffffffffffff;
            }
            pFVar8 = (Frag *)operator_new__(uVar7);
            if (uVar6 != 0) {
              local_2c8 = pFVar8;
              do {
                Frag::Frag(local_2c8);
                local_2c8 = local_2c8 + 1;
              } while (local_2c8 != pFVar8 + uVar6);
            }
            *(Frag **)(re_1 + 1) = pFVar8;
          }
          break;
        }
        top_arg_local = *(Frag *)((long)&re_1->down_ + 4);
      }
LAB_00145da5:
      std::
      stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
      ::pop(this->stack_);
      sVar9 = std::
              stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
              ::size(this->stack_);
      if (sVar9 == 0) {
        return top_arg_local;
      }
      re_1 = (Regexp *)
             std::
             stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
             ::top(this->stack_);
      if (((reference)re_1)->child_args == (Frag *)0x0) {
        ((reference)re_1)->child_arg = top_arg_local;
      }
      else {
        ((reference)re_1)->child_args[((reference)re_1)->n] = top_arg_local;
      }
      ((reference)re_1)->n = ((reference)re_1)->n + 1;
    }
    if ((local_208->nsub_ == 0) ||
       (local_238 = Regexp::sub(local_208), (int)(uint)local_208->nsub_ <= *(int *)&re_1->field_5))
    {
      uVar2._0_1_ = re_1[1].op_;
      uVar2._1_1_ = re_1[1].simple_;
      uVar2._2_2_ = re_1[1].parse_flags_;
      uVar2._4_2_ = re_1[1].ref_;
      uVar2._6_2_ = re_1[1].nsub_;
      top_arg_local.begin =
           (*this->_vptr_Walker[3])
                     (this,local_208,*(undefined8 *)((long)&re_1->field_5 + 4),
                      *(undefined8 *)((long)&re_1->down_ + 4),uVar2,(ulong)*(uint *)&re_1->field_5);
      top_arg_local.end.p = extraout_var_02.p;
      if ((1 < local_208->nsub_) && (*(void **)(re_1 + 1) != (void *)0x0)) {
        operator_delete__(*(void **)(re_1 + 1));
      }
      goto LAB_00145da5;
    }
    if (((local_29 & 1) == 0) ||
       ((*(int *)&re_1->field_5 < 1 ||
        (local_238[*(int *)&re_1->field_5 + -1] != local_238[*(int *)&re_1->field_5])))) {
      psVar1 = this->stack_;
      WalkState<re2::Frag>::WalkState
                (&local_278,local_238[*(int *)&re_1->field_5],*(Frag *)((long)&re_1->down_ + 4));
      std::
      stack<re2::WalkState<re2::Frag>,_std::deque<re2::WalkState<re2::Frag>,_std::allocator<re2::WalkState<re2::Frag>_>_>_>
      ::push(psVar1,&local_278);
    }
    else {
      local_248 = *(undefined8 *)(*(long *)(re_1 + 1) + (long)(*(int *)&re_1->field_5 + -1) * 8);
      iVar4 = (*this->_vptr_Walker[4])(this,local_248);
      local_240 = CONCAT44(extraout_var_01,iVar4);
      *(undefined8 *)(*(long *)(re_1 + 1) + (long)*(int *)&re_1->field_5 * 8) = local_240;
      *(int *)&re_1->field_5 = *(int *)&re_1->field_5 + 1;
    }
  } while( true );
}

Assistant:

T Regexp::Walker<T>::WalkInternal(Regexp* re, T top_arg,
                                                       bool use_copy) {
  Reset();

  if (re == NULL) {
    LOG(DFATAL) << "Walk NULL";
    return top_arg;
  }

  stack_->push(WalkState<T>(re, top_arg));

  WalkState<T>* s;
  for (;;) {
    T t;
    s = &stack_->top();
    Regexp* re = s->re;
    switch (s->n) {
      case -1: {
        if (--max_visits_ < 0) {
          stopped_early_ = true;
          t = ShortVisit(re, s->parent_arg);
          break;
        }
        bool stop = false;
        s->pre_arg = PreVisit(re, s->parent_arg, &stop);
        if (stop) {
          t = s->pre_arg;
          break;
        }
        s->n = 0;
        s->child_args = NULL;
        if (re->nsub_ == 1)
          s->child_args = &s->child_arg;
        else if (re->nsub_ > 1)
          s->child_args = new T[re->nsub_];
        // Fall through.
      }
      default: {
        if (re->nsub_ > 0) {
          Regexp** sub = re->sub();
          if (s->n < re->nsub_) {
            if (use_copy && s->n > 0 && sub[s->n - 1] == sub[s->n]) {
              s->child_args[s->n] = Copy(s->child_args[s->n - 1]);
              s->n++;
            } else {
              stack_->push(WalkState<T>(sub[s->n], s->pre_arg));
            }
            continue;
          }
        }

        t = PostVisit(re, s->parent_arg, s->pre_arg, s->child_args, s->n);
        if (re->nsub_ > 1)
          delete[] s->child_args;
        break;
      }
    }

    // We've finished stack_->top().
    // Update next guy down.
    stack_->pop();
    if (stack_->size() == 0)
      return t;
    s = &stack_->top();
    if (s->child_args != NULL)
      s->child_args[s->n] = t;
    else
      s->child_arg = t;
    s->n++;
  }
}